

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::HasLazyFields
               (Descriptor *descriptor,Options *options,MessageSCCAnalyzer *scc_analyzer)

{
  bool bVar1;
  FieldDescriptor *in_RAX;
  Descriptor *descriptor_00;
  MessageSCCAnalyzer *scc_analyzer_00;
  int field_idx;
  int iVar2;
  uint index;
  Options *options_00;
  
  for (iVar2 = 0; iVar2 < descriptor->field_count_; iVar2 = iVar2 + 1) {
    in_RAX = Descriptor::field(descriptor,iVar2);
  }
  for (iVar2 = 0; iVar2 < descriptor->extension_count_; iVar2 = iVar2 + 1) {
    in_RAX = Descriptor::extension(descriptor,iVar2);
  }
  for (index = 0; (int)index < descriptor->nested_type_count_; index = index + 1) {
    options_00 = (Options *)(ulong)index;
    descriptor_00 = Descriptor::nested_type(descriptor,index);
    bVar1 = HasLazyFields(descriptor_00,options_00,scc_analyzer_00);
    in_RAX = (FieldDescriptor *)(ulong)bVar1;
  }
  return SUB81(in_RAX,0);
}

Assistant:

static bool HasLazyFields(const Descriptor* descriptor, const Options& options,
                          MessageSCCAnalyzer* scc_analyzer) {
  for (int field_idx = 0; field_idx < descriptor->field_count(); field_idx++) {
    if (IsLazy(descriptor->field(field_idx), options, scc_analyzer)) {
      return true;
    }
  }
  for (int idx = 0; idx < descriptor->extension_count(); idx++) {
    if (IsLazy(descriptor->extension(idx), options, scc_analyzer)) {
      return true;
    }
  }
  for (int idx = 0; idx < descriptor->nested_type_count(); idx++) {
    if (HasLazyFields(descriptor->nested_type(idx), options, scc_analyzer)) {
      return true;
    }
  }
  return false;
}